

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamInBinary * __thiscall chrono::ChStreamInBinary::operator>>(ChStreamInBinary *this,char *str)

{
  int mlength;
  int local_1c;
  
  operator>>(this,&local_1c);
  (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,str,(long)local_1c);
  return this;
}

Assistant:

ChStreamInBinary& ChStreamInBinary::operator>>(char* str) {
    // Read string length , plus null-termination char
    int mlength;
    *this >> mlength;
    // Read all bytes of string.
    this->Input(str, mlength);
    return *this;
}